

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

shared_ptr<ear::PointSourcePanner> __thiscall
ear::configureFullPolarPanner(ear *this,Layout *layout)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  size_t sVar4;
  double dVar5;
  pointer pMVar6;
  bool bVar7;
  PointerType ptr;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  internal_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer psVar11;
  pointer *__ptr;
  long lVar12;
  shared_ptr<ear::PointSourcePanner> sVar13;
  _Head_base<0UL,_ear::RegionHandler_*,_false> local_238;
  MatrixXd positions;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  RegionHandler *local_208;
  vector<int,_std::allocator<int>_> realVertsVec;
  VectorXd centreDownmix;
  Facet realVerts;
  Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> outputChannels;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  positionsReal;
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  regions;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  facets;
  MatrixXd downmix;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  positionsNominal;
  Vector3d centrePosition;
  set<int,_std::less<int>,_std::allocator<int>_> virtualVerts;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_48;
  
  positionsReal.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positionsReal.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  positionsReal.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  positionsNominal.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positionsNominal.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  positionsNominal.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header;
  virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  virtualVerts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  getAugmentedLayout((tuple<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      *)&centrePosition,layout);
  realVerts._M_t._M_impl._0_8_ = &downmix;
  realVerts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &virtualVerts;
  realVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&positionsNominal;
  realVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&positionsReal;
  std::
  tuple<std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::set<int,std::less<int>,std::allocator<int>>&,Eigen::Matrix<double,-1,-1,0,-1,-1>&>
  ::operator=((tuple<std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::set<int,std::less<int>,std::allocator<int>>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
               *)&realVerts,
              (tuple<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               *)&centrePosition);
  std::
  _Tuple_impl<0UL,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&centrePosition);
  Layout::name_abi_cxx11_((string *)&centrePosition,layout);
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                  *)FACETS_abi_cxx11_,(key_type *)&centrePosition);
  std::__cxx11::string::~string((string *)&centrePosition);
  if (cVar8._M_node == (_Base_ptr)(FACETS_abi_cxx11_ + 8)) {
    convex_hull(&facets,&positionsNominal,1e-05);
  }
  else {
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::vector(&facets,(vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      *)(cVar8._M_node + 2));
  }
  regions.
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  regions.
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  regions.
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &realVerts._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var10 == &virtualVerts._M_t._M_impl.super__Rb_tree_header) break;
    _Var2 = p_Var10[1]._M_color;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::vector(&local_48,&facets);
    _adjacent_verts(&realVerts,&local_48,_Var2);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::~vector(&local_48);
    bVar7 = doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                      ((_Rb_tree_const_iterator<int>)
                       realVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<int>)p_Var1,
                       (_Rb_tree_const_iterator<int>)
                       virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<int>)
                       &virtualVerts._M_t._M_impl.super__Rb_tree_header);
    _assert_impl(!bVar7,"invalid triangulation");
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)&realVertsVec,
               (_Rb_tree_const_iterator<int>)
               realVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<int>)p_Var1,(allocator_type *)&centrePosition);
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
    MapBase((MapBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0> *)
            &outputChannels,
            realVertsVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start,
            (long)realVertsVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)realVertsVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2);
    centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)outputChannels._8_8_;
    centreDownmix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
    _0_4_ = 3;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&positions,(long *)&centrePosition,
               (int *)&centreDownmix);
    lVar12 = 0;
    for (p_Var9 = realVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pMVar6 = positionsReal.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, (_Rb_tree_header *)p_Var9 != p_Var1;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      _Var3 = p_Var9[1]._M_color;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&centrePosition,
                 &positions,lVar12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&centrePosition,
                 pMVar6 + (int)_Var3);
      lVar12 = lVar12 + 1;
    }
    centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = positionsReal.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)_Var2].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0];
    centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = positionsReal.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)_Var2].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
    centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = positionsReal.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)_Var2].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2];
    local_238._M_head_impl = (RegionHandler *)outputChannels._8_8_;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&centreDownmix,(long *)&local_238);
    dVar5 = (double)(long)outputChannels._8_8_;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_238._M_head_impl = (RegionHandler *)(1.0 / dVar5);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&centreDownmix,
               (Scalar *)&local_238);
    boost::
    make_unique<ear::VirtualNgon,Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&,Eigen::Matrix<double,3,1,0,3,1>&,Eigen::Matrix<double,_1,1,0,_1,1>&>
              ((boost *)&local_208,&outputChannels,&positions,
               (Matrix<double,_3,_1,_0,_3,_1> *)&centrePosition,
               (Matrix<double,__1,_1,_0,__1,_1> *)&centreDownmix);
    local_238._M_head_impl = local_208;
    local_208 = (RegionHandler *)0x0;
    std::
    vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
    ::emplace_back<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>
              ((vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
                *)&regions,
               (unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *)
               &local_238);
    if (local_238._M_head_impl != (RegionHandler *)0x0) {
      (*(local_238._M_head_impl)->_vptr_RegionHandler[2])();
    }
    local_238._M_head_impl = (RegionHandler *)0x0;
    if (local_208 != (RegionHandler *)0x0) {
      (*local_208->_vptr_RegionHandler[2])();
    }
    free((void *)CONCAT44(centreDownmix.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data._4_4_,
                          centreDownmix.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data._0_4_));
    free(positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&realVertsVec.super__Vector_base<int,_std::allocator<int>_>);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&realVerts._M_t);
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
  }
  psVar11 = facets.
            super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar11 ==
        facets.
        super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      make_shared<ear::PolarPointSourcePanner,std::vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>>
                ((vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
                  *)&realVerts);
      std::
      make_shared<ear::PointSourcePannerDownmix,std::shared_ptr<ear::PolarPointSourcePanner>,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                ((shared_ptr<ear::PolarPointSourcePanner> *)&centrePosition,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&realVerts);
      dVar5 = centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1];
      centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = 0.0;
      *(double *)this =
           centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[0];
      *(double *)(this + 8) = dVar5;
      centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &realVerts._M_t._M_impl.super__Rb_tree_header);
      std::
      vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
      ::~vector(&regions);
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::~vector(&facets);
      free(downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          );
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&virtualVerts._M_t);
      std::
      _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~_Vector_base(&positionsNominal.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     );
      std::
      _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~_Vector_base(&positionsReal.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     );
      sVar13.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar13.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<ear::PointSourcePanner>)
             sVar13.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
    }
    p_Var1 = &(psVar11->_M_t)._M_impl.super__Rb_tree_header;
    bVar7 = doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                      ((psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<int>)p_Var1,
                       (_Rb_tree_const_iterator<int>)
                       virtualVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<int>)
                       &virtualVerts._M_t._M_impl.super__Rb_tree_header);
    if (!bVar7) {
      sVar4 = (psVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      if (sVar4 == 4) {
        std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                  ((vector<int,std::allocator<int>> *)&realVerts,
                   (psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<int>)p_Var1,(allocator_type *)&centrePosition);
        outputChannels._0_8_ = *(undefined8 *)realVerts._M_t._M_impl._0_8_;
        outputChannels._8_8_ = *(undefined8 *)(realVerts._M_t._M_impl._0_8_ + 8);
        centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
        .array[0] = 1.97626258336499e-323;
        positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)
               CONCAT44(positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data._4_4_,3);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
                  ((Matrix<double,_1,_1,0,_1,_1> *)&realVertsVec,(long *)&centrePosition,
                   (int *)&positions);
        lVar12 = 0;
        for (p_Var10 = (psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pMVar6 = positionsReal.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, (_Rb_tree_header *)p_Var10 != p_Var1
            ; p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
          _Var2 = p_Var10[1]._M_color;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                     &centrePosition,(Matrix<double,__1,__1,_0,__1,__1> *)&realVertsVec,lVar12);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                     &centrePosition,pMVar6 + (int)_Var2);
          lVar12 = lVar12 + 1;
        }
        boost::
        make_unique<ear::QuadRegion,Eigen::Matrix<int,4,1,0,4,1>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                  ((boost *)&positions,(Matrix<int,_4,_1,_0,_4,_1> *)&outputChannels,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&realVertsVec);
        centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
        .array[0] = (double)positions.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
        positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)0x0;
        std::
        vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
        ::emplace_back<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>
                  ((vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
                    *)&regions,
                   (unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *)
                   &centrePosition);
      }
      else {
        if (sVar4 != 3) {
          this_00 = (internal_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&centrePosition,"facets with more than 4 vertices are not supported",
                     (allocator<char> *)&realVerts);
          internal_error::internal_error(this_00,(string *)&centrePosition);
          __cxa_throw(this_00,&internal_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                  ((vector<int,std::allocator<int>> *)&realVerts,
                   (psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<int>)p_Var1,(allocator_type *)&centrePosition);
        Eigen::PlainObjectBase<Eigen::Matrix<int,3,1,0,3,1>>::_init1<int*>
                  ((PlainObjectBase<Eigen::Matrix<int,3,1,0,3,1>> *)&outputChannels,
                   (Scalar *)realVerts._M_t._M_impl._0_8_);
        centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
        .array[0] = 1.48219693752374e-323;
        positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)
               CONCAT44(positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data._4_4_,3);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
                  ((Matrix<double,_1,_1,0,_1,_1> *)&realVertsVec,(long *)&centrePosition,
                   (int *)&positions);
        lVar12 = 0;
        for (p_Var10 = (psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pMVar6 = positionsReal.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, (_Rb_tree_header *)p_Var10 != p_Var1
            ; p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
          _Var2 = p_Var10[1]._M_color;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                     &centrePosition,(Matrix<double,__1,__1,_0,__1,__1> *)&realVertsVec,lVar12);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                     &centrePosition,pMVar6 + (int)_Var2);
          lVar12 = lVar12 + 1;
        }
        boost::
        make_unique<ear::Triplet,Eigen::Matrix<int,3,1,0,3,1>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                  ((boost *)&positions,(Matrix<int,_3,_1,_0,_3,_1> *)&outputChannels,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&realVertsVec);
        centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
        .array[0] = (double)positions.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
        positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)0x0;
        std::
        vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
        ::emplace_back<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>
                  ((vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
                    *)&regions,
                   (unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *)
                   &centrePosition);
      }
      if (centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0] != 0.0) {
        (**(code **)(*(long *)centrePosition.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[0] + 0x10))();
      }
      centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = 0.0;
      if (positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data != (double *)0x0) {
        (**(code **)((long)*positions.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data + 0x10))();
      }
      free(realVertsVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&realVerts);
    }
    psVar11 = psVar11 + 1;
  } while( true );
}

Assistant:

std::shared_ptr<PointSourcePanner> configureFullPolarPanner(
      const Layout& layout) {
    std::vector<Eigen::Vector3d> positionsReal;
    std::vector<Eigen::Vector3d> positionsNominal;
    std::set<int> virtualVerts;
    Eigen::MatrixXd downmix;
    std::tie(positionsReal, positionsNominal, virtualVerts, downmix) =
        getAugmentedLayout(layout);

    // Facets of the convex hull; each set represents a facet and contains the
    // indices of its corners in positions.
    auto facets_it = FACETS.find(layout.name());
    std::vector<Facet> facets = facets_it != FACETS.end()
                                    ? facets_it->second
                                    : convex_hull(positionsNominal);

    // Turn the facets into regions for the point source panner.
    std::vector<std::unique_ptr<RegionHandler>> regions;

    // Facets adjacent to one of the virtual speakers are turned into virtual
    // ngons, with an equal power downmix from the virtual speaker to the real
    // speakers.
    for (int virtualVert : virtualVerts) {
      Facet realVerts = _adjacent_verts(facets, virtualVert);

      ear_assert(!doIntersect(realVerts.begin(), realVerts.end(),
                              virtualVerts.begin(), virtualVerts.end()),
                 "invalid triangulation");

      std::vector<int> realVertsVec(realVerts.begin(), realVerts.end());
      Eigen::Map<Eigen::VectorXi> outputChannels(realVertsVec.data(),
                                                 realVertsVec.size());
      Eigen::MatrixXd positions(outputChannels.size(), 3);
      int rowIndex = 0;
      for (int vert : realVerts) {
        positions.row(rowIndex) = positionsReal[vert];
        ++rowIndex;
      }
      Eigen::Vector3d centrePosition = positionsReal[virtualVert];
      Eigen::VectorXd centreDownmix(outputChannels.size());
      centreDownmix.fill(1.0 /
                         std::sqrt(static_cast<double>(outputChannels.size())));

      regions.push_back(boost::make_unique<VirtualNgon>(
          outputChannels, positions, centrePosition, centreDownmix));
    }
    // Facets not adjacent to virtual speakers are turned into triplets or
    // quads. In the supported layouts there are never facets with more
    // vertices.
    for (const auto& facetVerts : facets) {
      if (doIntersect(facetVerts.begin(), facetVerts.end(),
                      virtualVerts.begin(), virtualVerts.end())) {
        continue;
      }

      if (facetVerts.size() == 3) {
        std::vector<int> facetVertsVec(facetVerts.begin(), facetVerts.end());
        Eigen::Vector3i outputChannels(facetVertsVec.data());
        Eigen::MatrixXd positions(outputChannels.size(), 3);
        int rowIndex = 0;
        for (int vert : facetVerts) {
          positions.row(rowIndex) = positionsReal[vert];
          ++rowIndex;
        }
        regions.push_back(
            boost::make_unique<Triplet>(outputChannels, positions));
      } else if (facetVerts.size() == 4) {
        std::vector<int> facetVertsVec(facetVerts.begin(), facetVerts.end());
        Eigen::Vector4i outputChannels(facetVertsVec.data());
        Eigen::MatrixXd positions(outputChannels.size(), 3);
        int rowIndex = 0;
        for (int vert : facetVerts) {
          positions.row(rowIndex) = positionsReal[vert];
          ++rowIndex;
        }
        regions.push_back(
            boost::make_unique<QuadRegion>(outputChannels, positions));
      } else {
        throw internal_error(
            "facets with more than 4 vertices are not supported");
      }
    }
    return std::make_shared<PointSourcePannerDownmix>(
        std::make_shared<PolarPointSourcePanner>(std::move(regions)), downmix);
  }